

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

string * __thiscall
cfd::core::Privkey::ConvertWif_abi_cxx11_
          (string *__return_storage_ptr__,Privkey *this,NetType net_type,bool is_compressed)

{
  _Alloc_hider _Var1;
  size_t sVar2;
  CfdException *this_00;
  undefined8 uVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *wally_string;
  int ret;
  char *wif_ptr;
  int local_6c;
  WallyUtil *local_68;
  string local_60;
  CfdSourceLocation local_40;
  
  local_68 = (WallyUtil *)0x0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&this->data_
                    );
  _Var1._M_p = local_60._M_dataplus._M_p;
  sVar2 = ByteData::GetDataSize(&this->data_);
  uVar3 = 0xef;
  if (net_type == kMainnet) {
    uVar3 = 0x80;
  }
  local_6c = wally_wif_from_bytes(_Var1._M_p,sVar2,uVar3,!is_compressed,&local_68);
  wally_string = extraout_RDX;
  if (local_60._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_60._M_dataplus._M_p);
    wally_string = extraout_RDX_00;
  }
  if (local_6c == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_(__return_storage_ptr__,local_68,wally_string);
    return __return_storage_ptr__;
  }
  local_40.filename = "cfdcore_key.cpp";
  local_40.line = 0x110;
  local_40.funcname = "ConvertWif";
  ByteData::GetHex_abi_cxx11_(&local_60,&this->data_);
  logger::log<int&,std::__cxx11::string&>
            (&local_40,kCfdLogLevelWarning,"wally_wif_from_bytes error. ret={} bytes={}.",&local_6c,
             &local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Error Private key to WIF.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_60);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string Privkey::ConvertWif(NetType net_type, bool is_compressed) const {
  uint32_t prefix = (net_type == kMainnet ? kPrefixMainnet : kPrefixTestnet);
  uint32_t flags =
      (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                     : WALLY_WIF_FLAG_UNCOMPRESSED);
  char *wif_ptr = NULL;

  int ret = wally_wif_from_bytes(
      data_.GetBytes().data(), data_.GetDataSize(), prefix, flags, &wif_ptr);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_wif_from_bytes error. ret={} bytes={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Error Private key to WIF.");
  }
  std::string wif = WallyUtil::ConvertStringAndFree(wif_ptr);
  return wif;
}